

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ns_close_conn(ns_connection *conn)

{
  ns_connection *pnVar1;
  ns_connection *pnVar2;
  ns_connection *pnVar3;
  
  ns_call(conn,5,(void *)0x0);
  pnVar1 = conn->next;
  pnVar2 = conn->prev;
  pnVar3 = pnVar2;
  if (pnVar2 == (ns_connection *)0x0) {
    pnVar3 = (ns_connection *)conn->mgr;
  }
  pnVar3->next = pnVar1;
  if (pnVar1 != (ns_connection *)0x0) {
    pnVar1->prev = pnVar2;
  }
  close(conn->sock);
  iobuf_free(&conn->recv_iobuf);
  iobuf_free(&conn->send_iobuf);
  free(conn);
  return;
}

Assistant:

static void ns_close_conn(struct ns_connection *conn) {
  DBG(("%p %d", conn, conn->flags));
  ns_call(conn, NS_CLOSE, NULL);
  ns_remove_conn(conn);
  ns_destroy_conn(conn);
}